

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shape.cpp
# Opt level: O0

void __thiscall sf::Shape::update(Shape *this)

{
  Vector2f VVar1;
  _func_int **pp_Var2;
  ulong uVar3;
  Vertex *pVVar4;
  VertexArray *this_00;
  Shape *this_01;
  long *in_RDI;
  float fVar5;
  FloatRect FVar6;
  size_t i;
  size_t count;
  size_t in_stack_ffffffffffffff98;
  VertexArray *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  Shape *this_02;
  ulong local_18;
  
  uVar3 = (**(code **)(*in_RDI + 0x18))();
  if (uVar3 < 3) {
    VertexArray::resize(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    VertexArray::resize(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  else {
    VertexArray::resize(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    for (local_18 = 0; local_18 < uVar3; local_18 = local_18 + 1) {
      VVar1 = (Vector2f)(**(code **)(*in_RDI + 0x20))(in_RDI,local_18);
      pVVar4 = VertexArray::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      pVVar4->position = VVar1;
    }
    this_00 = (VertexArray *)
              VertexArray::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    pVVar4 = VertexArray::operator[](this_00,in_stack_ffffffffffffff98);
    pVVar4->position = (Vector2f)(this_00->super_Drawable)._vptr_Drawable;
    this_01 = (Shape *)VertexArray::operator[](this_00,in_stack_ffffffffffffff98);
    pVVar4 = VertexArray::operator[](this_00,in_stack_ffffffffffffff98);
    (pVVar4->texCoords).y = (this_01->super_Transformable).m_origin.x;
    pp_Var2 = (this_01->super_Transformable)._vptr_Transformable;
    pVVar4->position = *(Vector2f *)&this_01->super_Drawable;
    *(_func_int ***)&pVVar4->color = pp_Var2;
    FVar6 = VertexArray::getBounds
                      ((VertexArray *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0))
    ;
    this_02 = FVar6._0_8_;
    in_RDI[0x26] = (long)this_02;
    in_RDI[0x27] = FVar6._8_8_;
    fVar5 = *(float *)(in_RDI + 0x26) + *(float *)(in_RDI + 0x27) / 2.0;
    pVVar4 = VertexArray::operator[](this_00,in_stack_ffffffffffffff98);
    (pVVar4->position).x = fVar5;
    fVar5 = *(float *)((long)in_RDI + 0x134) + *(float *)((long)in_RDI + 0x13c) / 2.0;
    pVVar4 = VertexArray::operator[](this_00,in_stack_ffffffffffffff98);
    (pVVar4->position).y = fVar5;
    updateFillColors(this_01);
    updateTexCoords(this_02);
    updateOutline(this);
  }
  return;
}

Assistant:

void Shape::update()
{
    // Get the total number of points of the shape
    std::size_t count = getPointCount();
    if (count < 3)
    {
        m_vertices.resize(0);
        m_outlineVertices.resize(0);
        return;
    }

    m_vertices.resize(count + 2); // + 2 for center and repeated first point

    // Position
    for (std::size_t i = 0; i < count; ++i)
        m_vertices[i + 1].position = getPoint(i);
    m_vertices[count + 1].position = m_vertices[1].position;

    // Update the bounding rectangle
    m_vertices[0] = m_vertices[1]; // so that the result of getBounds() is correct
    m_insideBounds = m_vertices.getBounds();

    // Compute the center and make it the first vertex
    m_vertices[0].position.x = m_insideBounds.left + m_insideBounds.width / 2;
    m_vertices[0].position.y = m_insideBounds.top + m_insideBounds.height / 2;

    // Color
    updateFillColors();

    // Texture coordinates
    updateTexCoords();

    // Outline
    updateOutline();
}